

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

const_iterator * __thiscall
llvm::sys::path::begin(const_iterator *__return_storage_ptr__,path *this,StringRef path,Style style)

{
  path pVar1;
  int iVar2;
  char *pcVar3;
  Style SVar4;
  size_t From;
  char *pcVar5;
  uint uVar6;
  StringRef Chars;
  StringRef local_40;
  
  pcVar5 = path.Data;
  SVar4 = (Style)path.Length;
  (__return_storage_ptr__->Path).Data = (char *)this;
  (__return_storage_ptr__->Path).Length = (size_t)pcVar5;
  if (pcVar5 == (char *)0x0) {
    pcVar3 = (char *)0x0;
    goto LAB_00d998b9;
  }
  pVar1 = *this;
  uVar6 = (uint)(byte)pVar1;
  local_40.Data = (char *)this;
  local_40.Length = (size_t)pcVar5;
  if (SVar4 == windows) {
    if (pcVar5 != (char *)0x1) {
      iVar2 = isalpha(uVar6);
      if ((iVar2 != 0) && (pcVar3 = (char *)0x2, this[1] == (path)0x3a)) goto LAB_00d998b9;
      goto LAB_00d997f8;
    }
LAB_00d99865:
    pcVar3 = (char *)0x1;
    if ((uVar6 == 0x2f) || (uVar6 == 0x5c && SVar4 == windows)) goto LAB_00d998b9;
LAB_00d9987f:
    pcVar5 = "/";
    if (SVar4 == windows) {
      pcVar5 = "\\/";
    }
    From = 0;
  }
  else {
LAB_00d997f8:
    if (pcVar5 < (char *)0x3) goto LAB_00d99865;
    if ((uVar6 != 0x2f) && (uVar6 != 0x5c || SVar4 != windows)) goto LAB_00d9987f;
    if (pVar1 != this[1]) goto LAB_00d99865;
    if ((this[2] == (path)0x2f) || (SVar4 == windows && this[2] == (path)0x5c)) goto LAB_00d99865;
    pcVar5 = "/";
    if (SVar4 == windows) {
      pcVar5 = "\\/";
    }
    From = 2;
  }
  Chars.Length = (ulong)(SVar4 == windows) + 1;
  Chars.Data = pcVar5;
  pcVar3 = (char *)StringRef::find_first_of(&local_40,Chars,From);
  this = (path *)local_40.Data;
  if (local_40.Length < pcVar3) {
    pcVar3 = (char *)local_40.Length;
  }
LAB_00d998b9:
  (__return_storage_ptr__->Component).Data = (char *)this;
  (__return_storage_ptr__->Component).Length = (size_t)pcVar3;
  __return_storage_ptr__->Position = 0;
  __return_storage_ptr__->S = SVar4;
  return __return_storage_ptr__;
}

Assistant:

const_iterator begin(StringRef path, Style style) {
  const_iterator i;
  i.Path      = path;
  i.Component = find_first_component(path, style);
  i.Position  = 0;
  i.S = style;
  return i;
}